

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentMap.cpp
# Opt level: O2

void __thiscall
EnvironmentMap::Reset
          (EnvironmentMap *this,shared_ptr<myvk::CommandPool> *command_pool,char *filename)

{
  float *__ptr;
  HdrImg img;
  vector<double,_std::allocator<double>_> weights;
  
  img = load_hdr_image(filename);
  __ptr = img.m_data;
  if (__ptr != (float *)0x0) {
    weigh_hdr_image(&weights,&img);
    create_images(this,command_pool,&img,&weights);
    free(__ptr);
    myvk::DescriptorSet::UpdateCombinedImageSampler
              ((this->m_descriptor_set).
               super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &this->m_sampler,&this->m_hdr_image_view,0,0);
    myvk::DescriptorSet::UpdateCombinedImageSampler
              ((this->m_descriptor_set).
               super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &this->m_sampler,&this->m_alias_table_image_view,1,0);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&weights.super__Vector_base<double,_std::allocator<double>_>);
  }
  return;
}

Assistant:

void EnvironmentMap::Reset(const std::shared_ptr<myvk::CommandPool> &command_pool, const char *filename) {
	HdrImg img = load_hdr_image(filename);
	if (!img.m_data)
		return;

	std::vector<double> weights = weigh_hdr_image(&img);
	create_images(command_pool, img, &weights);

	free(img.m_data); // release hdr image data

	m_descriptor_set->UpdateCombinedImageSampler(m_sampler, m_hdr_image_view, 0);
	m_descriptor_set->UpdateCombinedImageSampler(m_sampler, m_alias_table_image_view, 1);
}